

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O0

BSDF * __thiscall
pbrt::HairMaterial::GetBSDF<pbrt::UniversalTextureEvaluator>
          (void *param_1,TaggedPointer *param_2,undefined8 *param_3,void *param_4)

{
  TextureEvalContext ctx;
  TextureEvalContext ctx_00;
  TextureEvalContext ctx_01;
  TextureEvalContext ctx_02;
  TextureEvalContext ctx_03;
  TextureEvalContext ctx_04;
  TextureEvalContext ctx_05;
  TextureEvalContext ctx_06;
  bool bVar1;
  float *pfVar2;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar10 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  ulong uVar17;
  undefined1 auVar18 [56];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  SampledSpectrum SVar19;
  Float h;
  SampledSpectrum c;
  SampledSpectrum sig_a;
  Float e;
  Float a;
  Float bn;
  Float bm;
  undefined1 auVar20 [16];
  undefined1 in_stack_fffffffffffffb48 [64];
  SampledWavelengths *in_stack_fffffffffffffb88;
  HairBxDF *in_stack_fffffffffffffb90;
  BxDFHandle *in_stack_fffffffffffffb98;
  Vector3f *in_stack_fffffffffffffba0;
  char *in_stack_fffffffffffffba8;
  Normal3f *ns;
  undefined8 in_stack_fffffffffffffbb0;
  LogLevel level;
  Normal3f *n;
  Vector3f *wo;
  BSDF *this;
  FloatTextureHandle *in_stack_fffffffffffffbc8;
  Float in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd4;
  Float FVar21;
  Float local_424;
  undefined8 in_stack_fffffffffffffbe0;
  undefined8 in_stack_fffffffffffffbe8;
  BSDF *pBVar22;
  undefined1 (*__src) [64];
  undefined8 in_stack_fffffffffffffc10;
  SpectrumTextureHandle *in_stack_fffffffffffffc18;
  UniversalTextureEvaluator *in_stack_fffffffffffffc20;
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 in_stack_fffffffffffffc40 [44];
  undefined4 in_stack_fffffffffffffc6c;
  undefined1 in_stack_fffffffffffffc70 [16];
  array<float,_4> aVar26;
  SampledWavelengths in_stack_fffffffffffffc80;
  array<float,_4> aVar27;
  undefined1 auStack_360 [16];
  Float local_348;
  float local_344;
  undefined1 local_340 [64];
  Float local_2f8;
  float local_2f4 [11];
  undefined8 local_2c8;
  undefined8 local_2c0;
  undefined8 local_2b8;
  undefined8 local_2b0;
  SampledWavelengths *local_2a8;
  HairBxDF *pHStack_2a0;
  BxDFHandle *pBStack_298;
  Vector3f *pVStack_290;
  undefined1 local_288 [64];
  undefined8 local_238;
  undefined8 local_230;
  undefined8 local_228;
  undefined8 local_220;
  SampledWavelengths *local_218;
  HairBxDF *pHStack_210;
  BxDFHandle *pBStack_208;
  Vector3f *pVStack_200;
  undefined1 local_1f8 [64];
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 local_180;
  undefined1 local_178 [64];
  Float local_12c;
  undefined1 local_128 [64];
  Float local_dc;
  undefined1 local_d8 [64];
  Float local_8c;
  float local_88;
  float local_84;
  undefined1 local_80 [64];
  Float local_34;
  float local_30;
  float local_2c;
  void *local_28;
  undefined8 *local_20;
  TaggedPointer *local_18;
  void *local_8;
  
  level = (LogLevel)((ulong)in_stack_fffffffffffffbb0 >> 0x20);
  __src = (undefined1 (*) [64])&stack0x00000008;
  local_30 = 0.01;
  pBVar22 = (BSDF *)param_1;
  local_28 = param_4;
  local_20 = param_3;
  local_18 = param_2;
  local_8 = param_1;
  FloatTextureHandle::FloatTextureHandle
            (in_stack_fffffffffffffb48._8_8_,in_stack_fffffffffffffb48._0_8_);
  memcpy(local_80,__src,0x40);
  auVar3 = vmovdqu64_avx512f(local_80);
  auVar3 = vmovdqu64_avx512f(auVar3);
  auVar20 = auVar3._0_16_;
  ctx.p.super_Tuple3<pbrt::Point3,_float>.z = (float)(int)in_stack_fffffffffffffbe8;
  ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x =
       (float)(int)((ulong)in_stack_fffffffffffffbe8 >> 0x20);
  ctx.p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffbe0;
  ctx.p.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)in_stack_fffffffffffffbe0 >> 0x20)
  ;
  ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = param_1;
  ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = pBVar22;
  ctx._32_8_ = __src;
  ctx._40_8_ = param_2;
  ctx.dudy = (Float)(int)in_stack_fffffffffffffc10;
  ctx.dvdx = (Float)(int)((ulong)in_stack_fffffffffffffc10 >> 0x20);
  ctx._56_8_ = in_stack_fffffffffffffc18;
  local_34 = UniversalTextureEvaluator::operator()
                       ((UniversalTextureEvaluator *)
                        CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                        in_stack_fffffffffffffbc8,ctx);
  pfVar2 = std::max<float>(&local_30,&local_34);
  local_2c = *pfVar2;
  local_88 = 0.01;
  FloatTextureHandle::FloatTextureHandle(auVar20._8_8_,auVar20._0_8_);
  memcpy(local_d8,__src,0x40);
  auVar3 = vmovdqu64_avx512f(local_d8);
  auVar3 = vmovdqu64_avx512f(auVar3);
  auVar20 = auVar3._0_16_;
  ctx_00.p.super_Tuple3<pbrt::Point3,_float>.z = (float)(int)in_stack_fffffffffffffbe8;
  ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.x =
       (float)(int)((ulong)in_stack_fffffffffffffbe8 >> 0x20);
  ctx_00.p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffbe0;
  ctx_00.p.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)in_stack_fffffffffffffbe0 >> 0x20);
  ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = param_1;
  ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = pBVar22;
  ctx_00._32_8_ = __src;
  ctx_00._40_8_ = param_2;
  ctx_00.dudy = (Float)(int)in_stack_fffffffffffffc10;
  ctx_00.dvdx = (Float)(int)((ulong)in_stack_fffffffffffffc10 >> 0x20);
  ctx_00._56_8_ = in_stack_fffffffffffffc18;
  local_8c = UniversalTextureEvaluator::operator()
                       ((UniversalTextureEvaluator *)
                        CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                        in_stack_fffffffffffffbc8,ctx_00);
  pfVar2 = std::max<float>(&local_88,&local_8c);
  local_84 = *pfVar2;
  FloatTextureHandle::FloatTextureHandle(auVar20._8_8_,auVar20._0_8_);
  memcpy(local_128,__src,0x40);
  auVar3 = vmovdqu64_avx512f(local_128);
  auVar3 = vmovdqu64_avx512f(auVar3);
  auVar20 = auVar3._0_16_;
  ctx_01.p.super_Tuple3<pbrt::Point3,_float>.z = (float)(int)in_stack_fffffffffffffbe8;
  ctx_01.dpdx.super_Tuple3<pbrt::Vector3,_float>.x =
       (float)(int)((ulong)in_stack_fffffffffffffbe8 >> 0x20);
  ctx_01.p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffbe0;
  ctx_01.p.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)in_stack_fffffffffffffbe0 >> 0x20);
  ctx_01.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = param_1;
  ctx_01.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = pBVar22;
  ctx_01._32_8_ = __src;
  ctx_01._40_8_ = param_2;
  ctx_01.dudy = (Float)(int)in_stack_fffffffffffffc10;
  ctx_01.dvdx = (Float)(int)((ulong)in_stack_fffffffffffffc10 >> 0x20);
  ctx_01._56_8_ = in_stack_fffffffffffffc18;
  local_dc = UniversalTextureEvaluator::operator()
                       ((UniversalTextureEvaluator *)
                        CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                        in_stack_fffffffffffffbc8,ctx_01);
  FloatTextureHandle::FloatTextureHandle(auVar20._8_8_,auVar20._0_8_);
  memcpy(local_178,__src,0x40);
  auVar3 = vmovdqu64_avx512f(local_178);
  auVar3 = vmovdqu64_avx512f(auVar3);
  uVar17 = 0;
  ctx_02.p.super_Tuple3<pbrt::Point3,_float>.z = (float)(int)in_stack_fffffffffffffbe8;
  ctx_02.dpdx.super_Tuple3<pbrt::Vector3,_float>.x =
       (float)(int)((ulong)in_stack_fffffffffffffbe8 >> 0x20);
  ctx_02.p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffbe0;
  ctx_02.p.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)in_stack_fffffffffffffbe0 >> 0x20);
  ctx_02.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = param_1;
  ctx_02.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = pBVar22;
  ctx_02._32_8_ = __src;
  ctx_02._40_8_ = param_2;
  ctx_02.dudy = (Float)(int)in_stack_fffffffffffffc10;
  ctx_02.dvdx = (Float)(int)((ulong)in_stack_fffffffffffffc10 >> 0x20);
  ctx_02._56_8_ = in_stack_fffffffffffffc18;
  local_12c = UniversalTextureEvaluator::operator()
                        ((UniversalTextureEvaluator *)
                         CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                         in_stack_fffffffffffffbc8,ctx_02);
  SampledSpectrum::SampledSpectrum((SampledSpectrum *)0x6def12);
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(param_2);
  if (bVar1) {
    SpectrumTextureHandle::SpectrumTextureHandle(auVar3._8_8_,auVar3._0_8_);
    auVar3 = vmovdqu64_avx512f(*__src);
    local_1f8 = vmovdqu64_avx512f(auVar3);
    in_stack_fffffffffffffb88 = (SampledWavelengths *)*local_20;
    in_stack_fffffffffffffb90 = (HairBxDF *)local_20[1];
    in_stack_fffffffffffffb98 = (BxDFHandle *)local_20[2];
    in_stack_fffffffffffffba0 = (Vector3f *)local_20[3];
    auVar4 = vmovdqu64_avx512f(local_1f8);
    auVar3 = vmovdqu64_avx512f(auVar4);
    auVar10 = ZEXT856(auVar4._8_8_);
    auVar18 = ZEXT856(uVar17);
    ctx_05.dudx = (Float)in_stack_fffffffffffffc6c;
    auVar23 = in_stack_fffffffffffffc40._0_12_;
    auVar24 = in_stack_fffffffffffffc40._12_12_;
    auVar25 = in_stack_fffffffffffffc40._24_12_;
    ctx_05.p.super_Tuple3<pbrt::Point3,_float>.x = (float)auVar23._0_4_;
    ctx_05.p.super_Tuple3<pbrt::Point3,_float>.y = (float)auVar23._4_4_;
    ctx_05.p.super_Tuple3<pbrt::Point3,_float>.z = (float)auVar23._8_4_;
    ctx_05.dpdx.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar24._0_4_;
    ctx_05.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar24._4_4_;
    ctx_05.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = (float)auVar24._8_4_;
    ctx_05.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar25._0_4_;
    ctx_05.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar25._4_4_;
    ctx_05.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)auVar25._8_4_;
    ctx_05.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)(int)in_stack_fffffffffffffc40._36_8_;
    ctx_05.uv.super_Tuple2<pbrt::Point2,_float>.y =
         (float)(int)((ulong)in_stack_fffffffffffffc40._36_8_ >> 0x20);
    ctx_05.dudy = (Float)in_stack_fffffffffffffc70._0_4_;
    ctx_05.dvdx = (Float)in_stack_fffffffffffffc70._4_4_;
    ctx_05.dvdy = (Float)in_stack_fffffffffffffc70._8_4_;
    ctx_05.faceIndex = in_stack_fffffffffffffc70._12_4_;
    local_218 = in_stack_fffffffffffffb88;
    pHStack_210 = in_stack_fffffffffffffb90;
    pBStack_208 = in_stack_fffffffffffffb98;
    pVStack_200 = in_stack_fffffffffffffba0;
    SVar19 = UniversalTextureEvaluator::operator()
                       (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,ctx_05,
                        in_stack_fffffffffffffc80);
    auVar11._0_8_ = SVar19.values.values._8_8_;
    auVar11._8_56_ = auVar18;
    auVar4._0_8_ = SVar19.values.values._0_8_;
    auVar4._8_56_ = auVar10;
    local_1a8 = vmovlpd_avx(auVar4._0_16_);
    local_1a0 = vmovlpd_avx(auVar11._0_16_);
    SVar19 = ClampZero(auVar3._8_8_);
    auVar12._0_8_ = SVar19.values.values._8_8_;
    auVar12._8_56_ = auVar18;
    auVar5._0_8_ = SVar19.values.values._0_8_;
    auVar5._8_56_ = auVar10;
    local_198 = vmovlpd_avx(auVar5._0_16_);
    local_190 = vmovlpd_avx(auVar12._0_16_);
    local_188 = local_198;
    local_180 = local_190;
  }
  else {
    bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(param_2 + 8);
    if (bVar1) {
      SpectrumTextureHandle::SpectrumTextureHandle(auVar3._8_8_,auVar3._0_8_);
      auVar3 = vmovdqu64_avx512f(*__src);
      local_288 = vmovdqu64_avx512f(auVar3);
      in_stack_fffffffffffffb88 = (SampledWavelengths *)*local_20;
      in_stack_fffffffffffffb90 = (HairBxDF *)local_20[1];
      in_stack_fffffffffffffb98 = (BxDFHandle *)local_20[2];
      in_stack_fffffffffffffba0 = (Vector3f *)local_20[3];
      auVar4 = vmovdqu64_avx512f(local_288);
      auVar3 = vmovdqu64_avx512f(auVar4);
      auVar10 = ZEXT856(auVar4._8_8_);
      auVar18 = ZEXT856(uVar17);
      ctx_06.dudx = (Float)in_stack_fffffffffffffc6c;
      auVar23 = in_stack_fffffffffffffc40._0_12_;
      auVar24 = in_stack_fffffffffffffc40._12_12_;
      auVar25 = in_stack_fffffffffffffc40._24_12_;
      ctx_06.p.super_Tuple3<pbrt::Point3,_float>.x = (float)auVar23._0_4_;
      ctx_06.p.super_Tuple3<pbrt::Point3,_float>.y = (float)auVar23._4_4_;
      ctx_06.p.super_Tuple3<pbrt::Point3,_float>.z = (float)auVar23._8_4_;
      ctx_06.dpdx.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar24._0_4_;
      ctx_06.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar24._4_4_;
      ctx_06.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = (float)auVar24._8_4_;
      ctx_06.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar25._0_4_;
      ctx_06.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar25._4_4_;
      ctx_06.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)auVar25._8_4_;
      ctx_06.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)(int)in_stack_fffffffffffffc40._36_8_;
      ctx_06.uv.super_Tuple2<pbrt::Point2,_float>.y =
           (float)(int)((ulong)in_stack_fffffffffffffc40._36_8_ >> 0x20);
      ctx_06.dudy = (Float)in_stack_fffffffffffffc70._0_4_;
      ctx_06.dvdx = (Float)in_stack_fffffffffffffc70._4_4_;
      ctx_06.dvdy = (Float)in_stack_fffffffffffffc70._8_4_;
      ctx_06.faceIndex = in_stack_fffffffffffffc70._12_4_;
      local_2a8 = in_stack_fffffffffffffb88;
      pHStack_2a0 = in_stack_fffffffffffffb90;
      pBStack_298 = in_stack_fffffffffffffb98;
      pVStack_290 = in_stack_fffffffffffffba0;
      SVar19 = UniversalTextureEvaluator::operator()
                         (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,ctx_06,
                          in_stack_fffffffffffffc80);
      auVar13._0_8_ = SVar19.values.values._8_8_;
      auVar13._8_56_ = auVar18;
      auVar6._0_8_ = SVar19.values.values._0_8_;
      auVar6._8_56_ = auVar10;
      local_238 = vmovlpd_avx(auVar6._0_16_);
      local_230 = vmovlpd_avx(auVar13._0_16_);
      SVar19 = Clamp<int,int>(auVar3._8_8_,auVar3._4_4_,auVar3._0_4_);
      auVar14._0_8_ = SVar19.values.values._8_8_;
      auVar14._8_56_ = auVar18;
      auVar7._0_8_ = SVar19.values.values._0_8_;
      auVar7._8_56_ = auVar10;
      local_228 = vmovlpd_avx(auVar7._0_16_);
      local_220 = vmovlpd_avx(auVar14._0_16_);
      auVar10 = (undefined1  [56])0x0;
      SVar19 = HairBxDF::SigmaAFromReflectance(auVar3._40_8_,auVar3._36_4_,auVar3._24_8_);
      auVar15._0_8_ = SVar19.values.values._8_8_;
      auVar15._8_56_ = auVar18;
      auVar8._0_8_ = SVar19.values.values._0_8_;
      auVar8._8_56_ = auVar10;
      local_2b8 = vmovlpd_avx(auVar8._0_16_);
      local_2b0 = vmovlpd_avx(auVar15._0_16_);
      local_188 = local_2b8;
      local_180 = local_2b0;
    }
    else {
      bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(param_2 + 0x10);
      if ((!bVar1) && (bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(param_2 + 0x18), !bVar1))
      {
        LogFatal<char_const(&)[25]>
                  (level,in_stack_fffffffffffffba8,(int)((ulong)in_stack_fffffffffffffba0 >> 0x20),
                   (char *)in_stack_fffffffffffffb98,(char (*) [25])in_stack_fffffffffffffb90);
      }
      local_2f4[0] = 0.0;
      bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(param_2 + 0x10);
      if (bVar1) {
        FloatTextureHandle::FloatTextureHandle(auVar3._8_8_,auVar3._0_8_);
        memcpy(local_340,__src,0x40);
        auVar3 = vmovdqu64_avx512f(local_340);
        auVar3 = vmovdqu64_avx512f(auVar3);
        ctx_03.p.super_Tuple3<pbrt::Point3,_float>.z = (float)(int)in_stack_fffffffffffffbe8;
        ctx_03.dpdx.super_Tuple3<pbrt::Vector3,_float>.x =
             (float)(int)((ulong)in_stack_fffffffffffffbe8 >> 0x20);
        ctx_03.p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffbe0;
        ctx_03.p.super_Tuple3<pbrt::Point3,_float>.y =
             (float)(int)((ulong)in_stack_fffffffffffffbe0 >> 0x20);
        ctx_03.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = param_1;
        ctx_03.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = pBVar22;
        ctx_03._32_8_ = __src;
        ctx_03._40_8_ = param_2;
        ctx_03.dudy = (Float)(int)in_stack_fffffffffffffc10;
        ctx_03.dvdx = (Float)(int)((ulong)in_stack_fffffffffffffc10 >> 0x20);
        ctx_03._56_8_ = in_stack_fffffffffffffc18;
        local_424 = UniversalTextureEvaluator::operator()
                              ((UniversalTextureEvaluator *)
                               CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                               in_stack_fffffffffffffbc8,ctx_03);
      }
      else {
        local_424 = 0.0;
      }
      local_2f8 = local_424;
      std::max<float>(local_2f4,&local_2f8);
      local_344 = 0.0;
      bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(param_2 + 0x18);
      if (bVar1) {
        FloatTextureHandle::FloatTextureHandle(auVar3._8_8_,auVar3._0_8_);
        memcpy(&stack0xfffffffffffffc70,__src,0x40);
        aVar26 = in_stack_fffffffffffffc80.lambda.values;
        aVar27 = in_stack_fffffffffffffc80.pdf.values;
        auVar3._16_4_ = aVar26.values[0];
        auVar3._20_4_ = aVar26.values[1];
        auVar3._24_4_ = aVar26.values[2];
        auVar3._28_4_ = aVar26.values[3];
        auVar3._32_4_ = aVar27.values[0];
        auVar3._36_4_ = aVar27.values[1];
        auVar3._40_4_ = aVar27.values[2];
        auVar3._44_4_ = aVar27.values[3];
        auVar3._0_16_ = in_stack_fffffffffffffc70;
        auVar3._48_16_ = auStack_360;
        auVar3 = vmovdqu64_avx512f(auVar3);
        auVar3 = vmovdqu64_avx512f(auVar3);
        ctx_04.p.super_Tuple3<pbrt::Point3,_float>.z = (float)(int)in_stack_fffffffffffffbe8;
        ctx_04.dpdx.super_Tuple3<pbrt::Vector3,_float>.x =
             (float)(int)((ulong)in_stack_fffffffffffffbe8 >> 0x20);
        ctx_04.p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffbe0;
        ctx_04.p.super_Tuple3<pbrt::Point3,_float>.y =
             (float)(int)((ulong)in_stack_fffffffffffffbe0 >> 0x20);
        ctx_04.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = param_1;
        ctx_04.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = pBVar22;
        ctx_04._32_8_ = __src;
        ctx_04._40_8_ = param_2;
        ctx_04.dudy = (Float)(int)in_stack_fffffffffffffc10;
        ctx_04.dvdx = (Float)(int)((ulong)in_stack_fffffffffffffc10 >> 0x20);
        ctx_04._56_8_ = in_stack_fffffffffffffc18;
        FVar21 = UniversalTextureEvaluator::operator()
                           ((UniversalTextureEvaluator *)
                            CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                            in_stack_fffffffffffffbc8,ctx_04);
      }
      else {
        FVar21 = 0.0;
      }
      local_348 = FVar21;
      std::max<float>(&local_344,&local_348);
      auVar10 = (undefined1  [56])0x0;
      auVar18 = (undefined1  [56])0x0;
      HairBxDF::SigmaAFromConcentration(FVar21,in_stack_fffffffffffffbd0);
      SVar19 = RGBSpectrum::Sample((RGBSpectrum *)in_stack_fffffffffffffb90,
                                   in_stack_fffffffffffffb88);
      auVar16._0_8_ = SVar19.values.values._8_8_;
      auVar16._8_56_ = auVar18;
      auVar9._0_8_ = SVar19.values.values._0_8_;
      auVar9._8_56_ = auVar10;
      local_2c8 = vmovlpd_avx(auVar9._0_16_);
      local_2c0 = vmovlpd_avx(auVar16._0_16_);
      local_188 = local_2c8;
      local_180 = local_2c0;
    }
  }
  pfVar2 = Tuple2<pbrt::Point2,_float>::operator[]((Tuple2<pbrt::Point2,_float> *)(*__src + 0x24),1)
  ;
  auVar20 = auVar3._0_16_;
  vfmadd213ss_fma(SUB6416(ZEXT464(0x40000000),0),ZEXT416((uint)*pfVar2),
                  SUB6416(ZEXT464(0xbf800000),0));
  HairBxDF::HairBxDF(in_stack_fffffffffffffb90,(Float)((ulong)in_stack_fffffffffffffb88 >> 0x20),
                     SUB84(in_stack_fffffffffffffb88,0),auVar3._56_8_,auVar3._52_4_,auVar3._48_4_,
                     auVar3._44_4_);
  FVar21 = (Float)((ulong)in_stack_fffffffffffffb90 >> 0x20);
  memcpy(local_28,&stack0xfffffffffffffc1c,0x50);
  ns = (Normal3f *)(__src + 1);
  n = (Normal3f *)(__src[1] + 0xc);
  wo = (Vector3f *)(__src[1] + 0x18);
  this = (BSDF *)(__src[1] + 0x24);
  BxDFHandle::TaggedPointer<pbrt::HairBxDF>(auVar20._8_8_,auVar20._0_8_);
  BSDF::BSDF(this,wo,n,ns,in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,FVar21);
  return pBVar22;
}

Assistant:

PBRT_CPU_GPU BSDF GetBSDF(TextureEvaluator texEval, MaterialEvalContext ctx,
                              SampledWavelengths &lambda, HairBxDF *bxdf) const {
        Float bm = std::max<Float>(1e-2, texEval(beta_m, ctx));
        Float bn = std::max<Float>(1e-2, texEval(beta_n, ctx));
        Float a = texEval(alpha, ctx);
        Float e = texEval(eta, ctx);

        SampledSpectrum sig_a;
        if (sigma_a)
            sig_a = ClampZero(texEval(sigma_a, ctx, lambda));
        else if (color) {
            SampledSpectrum c = Clamp(texEval(color, ctx, lambda), 0, 1);
            sig_a = HairBxDF::SigmaAFromReflectance(c, bn, lambda);
        } else {
            CHECK(eumelanin || pheomelanin);
            sig_a = HairBxDF::SigmaAFromConcentration(
                        std::max(Float(0), eumelanin ? texEval(eumelanin, ctx) : 0),
                        std::max(Float(0), pheomelanin ? texEval(pheomelanin, ctx) : 0))
                        .Sample(lambda);
        }

        // Offset along width
        Float h = -1 + 2 * ctx.uv[1];
        *bxdf = HairBxDF(h, e, sig_a, bm, bn, a);
        return BSDF(ctx.wo, ctx.n, ctx.ns, ctx.dpdus, bxdf, e);
    }